

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall GameBoard::spawn_snake(GameBoard *this)

{
  Snake *this_00;
  Snake *local_18;
  
  this_00 = (Snake *)operator_new(0x68);
  Snake::Snake(this_00,this);
  local_18 = this_00;
  std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
            ((vector<Snake*,std::allocator<Snake*>> *)&this->snakes,&local_18);
  return;
}

Assistant:

void GameBoard::spawn_snake() {
    this->snakes.push_back(new Snake(this));
}